

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

bool el::Configurations::Parser::isLevel(string *line)

{
  int iVar1;
  bool bVar2;
  long *local_38;
  string *local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"*","");
  if ((string *)line->_M_string_length < local_30) {
    bVar2 = false;
  }
  else {
    iVar1 = std::__cxx11::string::compare((ulong)line,0,local_30);
    bVar2 = iVar1 == 0;
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return bVar2;
}

Assistant:

bool Configurations::Parser::isLevel(const std::string& line) {
  return base::utils::Str::startsWith(line, std::string(base::consts::kConfigurationLevel));
}